

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

ssize_t __thiscall
Json::StyledWriter::write_abi_cxx11_(StyledWriter *this,int __fd,void *__buf,size_t __n)

{
  string *psVar1;
  undefined4 in_register_00000034;
  StyledWriter *this_00;
  
  this_00 = (StyledWriter *)CONCAT44(in_register_00000034,__fd);
  psVar1 = &this_00->document_;
  std::__cxx11::string::assign((char *)psVar1);
  this_00->addChildValues_ = false;
  std::__cxx11::string::assign((char *)&this_00->indentString_);
  writeCommentBeforeValue(this_00,(Value *)__buf);
  writeValue(this_00,(Value *)__buf);
  writeCommentAfterValueOnSameLine(this_00,(Value *)__buf);
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::string::string((string *)this,(string *)psVar1);
  return (ssize_t)this;
}

Assistant:

JSONCPP_STRING StyledWriter::write(const Value& root) {
  document_ = "";
  addChildValues_ = false;
  indentString_ = "";
  writeCommentBeforeValue(root);
  writeValue(root);
  writeCommentAfterValueOnSameLine(root);
  document_ += "\n";
  return document_;
}